

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O3

string * __thiscall
mnf::RealSpace::toString
          (string *__return_storage_ptr__,RealSpace *this,ConstRefVec *val,string *prefix,
          IOFormat *fmt)

{
  ostream *s;
  stringstream ss;
  WithFormat<Eigen::Transpose<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  local_2a0;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  s = std::__ostream_insert<char,std::char_traits<char>>
                (local_198,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  local_2a0.m_matrix.m_matrix = val;
  Eigen::IOFormat::IOFormat(&local_2a0.m_format,fmt);
  Eigen::operator<<(s,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.coeffSeparator._M_dataplus._M_p !=
      &local_2a0.m_format.coeffSeparator.field_2) {
    operator_delete(local_2a0.m_format.coeffSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.rowSpacer._M_dataplus._M_p != &local_2a0.m_format.rowSpacer.field_2) {
    operator_delete(local_2a0.m_format.rowSpacer._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.rowSeparator._M_dataplus._M_p !=
      &local_2a0.m_format.rowSeparator.field_2) {
    operator_delete(local_2a0.m_format.rowSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.rowSuffix._M_dataplus._M_p != &local_2a0.m_format.rowSuffix.field_2) {
    operator_delete(local_2a0.m_format.rowSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.rowPrefix._M_dataplus._M_p != &local_2a0.m_format.rowPrefix.field_2) {
    operator_delete(local_2a0.m_format.rowPrefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.matSuffix._M_dataplus._M_p != &local_2a0.m_format.matSuffix.field_2) {
    operator_delete(local_2a0.m_format.matSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.m_format.matPrefix._M_dataplus._M_p != &local_2a0.m_format.matPrefix.field_2) {
    operator_delete(local_2a0.m_format.matPrefix._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string RealSpace::toString(const ConstRefVec& val,
                                const std::string& prefix,
                                const Eigen::IOFormat& fmt) const
{
  std::stringstream ss;
  ss << prefix << val.transpose().format(fmt);
  return ss.str();
}